

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

void __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
~AlexDataNode(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
              *this)

{
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  (in_RDI->super_AlexNode<int,_int>)._vptr_AlexNode = (_func_int **)&PTR__AlexDataNode_001b3aa8;
  if (in_RDI->key_slots_ != (int *)0x0) {
    key_allocator(in_RDI);
    __gnu_cxx::new_allocator<int>::deallocate
              ((new_allocator<int> *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
               (int *)in_RDI,0x13a98a);
    std::allocator<int>::~allocator((allocator<int> *)0x13a996);
    payload_allocator(in_RDI);
    __gnu_cxx::new_allocator<int>::deallocate
              ((new_allocator<int> *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
               (int *)in_RDI,0x13a9bc);
    std::allocator<int>::~allocator((allocator<int> *)0x13a9c8);
    bitmap_allocator(in_RDI);
    __gnu_cxx::new_allocator<unsigned_long>::deallocate
              ((new_allocator<unsigned_long> *)
               CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),(unsigned_long *)in_RDI
               ,0x13a9ee);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x13a9fa);
  }
  AlexNode<int,_int>::~AlexNode(&in_RDI->super_AlexNode<int,_int>);
  return;
}

Assistant:

~AlexDataNode() {
#if ALEX_DATA_NODE_SEP_ARRAYS
    if (key_slots_ == nullptr) {
      return;
    }
    key_allocator().deallocate(key_slots_, data_capacity_);
    payload_allocator().deallocate(payload_slots_, data_capacity_);
#else
    if (data_slots_ == nullptr) {
      return;
    }
    value_allocator().deallocate(data_slots_, data_capacity_);
#endif
    bitmap_allocator().deallocate(bitmap_, bitmap_size_);
  }